

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

int nghttp2_hd_deflate_new2
              (nghttp2_hd_deflater **deflater_ptr,size_t deflate_hd_table_bufsize_max,
              nghttp2_mem *mem)

{
  nghttp2_hd_deflater *deflater_00;
  nghttp2_hd_deflater *deflater;
  nghttp2_mem *pnStack_28;
  int rv;
  nghttp2_mem *mem_local;
  size_t deflate_hd_table_bufsize_max_local;
  nghttp2_hd_deflater **deflater_ptr_local;
  
  pnStack_28 = mem;
  if (mem == (nghttp2_mem *)0x0) {
    pnStack_28 = nghttp2_mem_default();
  }
  deflater_00 = (nghttp2_hd_deflater *)nghttp2_mem_malloc(pnStack_28,0x458);
  if (deflater_00 == (nghttp2_hd_deflater *)0x0) {
    deflater_ptr_local._4_4_ = -0x385;
  }
  else {
    deflater_ptr_local._4_4_ =
         nghttp2_hd_deflate_init2(deflater_00,deflate_hd_table_bufsize_max,pnStack_28);
    if (deflater_ptr_local._4_4_ == 0) {
      *deflater_ptr = deflater_00;
      deflater_ptr_local._4_4_ = 0;
    }
    else {
      nghttp2_mem_free(pnStack_28,deflater_00);
    }
  }
  return deflater_ptr_local._4_4_;
}

Assistant:

int nghttp2_hd_deflate_new2(nghttp2_hd_deflater **deflater_ptr,
                            size_t deflate_hd_table_bufsize_max,
                            nghttp2_mem *mem) {
  int rv;
  nghttp2_hd_deflater *deflater;

  if (mem == NULL) {
    mem = nghttp2_mem_default();
  }

  deflater = nghttp2_mem_malloc(mem, sizeof(nghttp2_hd_deflater));

  if (deflater == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  rv = nghttp2_hd_deflate_init2(deflater, deflate_hd_table_bufsize_max, mem);

  if (rv != 0) {
    nghttp2_mem_free(mem, deflater);

    return rv;
  }

  *deflater_ptr = deflater;

  return 0;
}